

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_sophia.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int eventID;
  int iVar5;
  long lVar6;
  undefined1 auStack_8cc58 [8];
  sophia_interface SI;
  sophiaevent_output seo;
  ofstream outfile;
  ios_base local_148 [264];
  long local_40;
  ulong local_38;
  
  *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 10;
  std::ofstream::ofstream((ofstream *)&seo.Nout);
  std::ofstream::open((char *)&seo.Nout,0x102018);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seo.Nout,"eventID\t",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seo.Nout,"partID\t",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seo.Nout,"EGeV\n",5);
  local_38 = 0;
  do {
    sophia_interface::sophiaevent((bool)((char)&SI + 'H'),1000000000.0,1e-09,SUB81(auStack_8cc58,0))
    ;
    local_40 = (long)seo.outPartID[0x7ce];
    if (0 < local_40) {
      iVar1 = (int)local_38;
      lVar6 = 0;
      do {
        iVar5 = 5;
        do {
          if (iVar5 == 2) {
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&seo.Nout,iVar1 + 1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            iVar2 = ID_sophia_to_PDG(seo.outPartID[lVar6 + -2]);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
            poVar4 = std::ostream::_M_insert<double>(seo.outPartP[2][lVar6 + 1999]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          }
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        lVar6 = lVar6 + 1;
      } while (lVar6 != local_40);
    }
    uVar3 = (int)local_38 + 1;
    local_38 = (ulong)uVar3;
  } while (uVar3 != 10000);
  std::ofstream::close();
  seo._88000_8_ = _VTT;
  *(undefined8 *)((long)&seo.Nout + *(long *)(_VTT + -0x18)) =
       ___ostream_insert<char,std::char_traits<char>>;
  std::filebuf::~filebuf((filebuf *)&outfile);
  std::ios_base::~ios_base(local_148);
  return 0;
}

Assistant:

int main() {
    std::cout.precision(10);

    bool onProton = true;
    // bool onProton = false;
    double Ein = 1e9;  // GeV
    double eps = 1e-9;  // GeV
    bool declareChargedPionsStable = true;
    // bool declareChargedPionsStable = false;

    std::ofstream outfile;
    outfile.open("outData.csv");

    outfile << "eventID\t" << "partID\t" << "EGeV\n";

    int nEvent = 10000;
    for (int k = 0; k < nEvent; ++k) {

        sophia_interface SI;

        // std::cout << "Event # " << k + 1 << std::endl;

        sophiaevent_output seo = SI.sophiaevent(onProton, Ein, eps, declareChargedPionsStable);


        // std::cout << "\nevent result # " << (k + 1) << std::endl;
        int Nout = seo.Nout;
        // std::cout << "N = " <<Nout << std::endl;
        for (int i = 0; i < Nout; ++i) {
        //     std::cout << "ID = " << ID_sophia_to_PDG(seo.outPartID[i]) << std::endl;
            for (int j = 0; j < 5; ++j) {
                // if (j == 3) std::cout << seo.outPartP[j][i] << std::endl;
                if (j == 3) {
                    int eventID = k + 1;
                    outfile << eventID << "\t"
                            << ID_sophia_to_PDG(seo.outPartID[i]) << "\t"
                            << seo.outPartP[j][i] << "\n";
                }
            }
        }
        // std::cout << "\n---------------------------------" << std::endl;
    }
    outfile.close();
}